

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O3

int Maj_ManAddCnfStart(Maj_Man_t *p)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  int (*paiVar5) [32];
  uint *plits;
  long lVar6;
  uint nlits;
  int *piVar7;
  int *piVar8;
  int (*paiVar9) [32];
  int (*paaiVar10) [3] [32];
  int *piVar11;
  long lVar12;
  long lVar13;
  int *piVar14;
  int pLits2 [2];
  int pLits [32];
  uint local_100;
  uint local_fc;
  long local_f8;
  int *local_f0;
  long local_e8;
  int (*local_e0) [32];
  int (*local_d8) [3] [32];
  int (*local_d0) [32];
  int (*local_c8) [3] [32];
  int (*local_c0) [3] [32];
  uint local_b8 [34];
  
  lVar12 = (long)p->nVars;
  uVar3 = p->nObjs;
  if ((int)uVar3 <= p->nVars + 2) {
LAB_005a8e33:
    if (3 < (int)uVar3) {
      lVar12 = 2;
      lVar13 = 0x28;
      do {
        if (p->vOutLits->nSize <= lVar12) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        pVVar1 = p->vOutLits->pArray;
        iVar2 = *(int *)((long)pVVar1 + lVar13 + -4);
        if (iVar2 < 1) {
          __assert_fail("Vec_IntSize(vArray) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                        ,0x134,"int Maj_ManAddCnfStart(Maj_Man_t *)");
        }
        iVar2 = bmcg_sat_solver_addclause(p->pSat,*(int **)((long)&pVVar1->nCap + lVar13),iVar2);
        if (iVar2 == 0) {
          return 0;
        }
        lVar12 = lVar12 + 1;
        lVar13 = lVar13 + 0x10;
      } while (lVar12 < (long)p->nObjs + -1);
    }
    return 1;
  }
  local_c0 = p->VarMarks;
  lVar13 = lVar12 + 2;
  paaiVar10 = p->VarMarks + lVar12 + 2;
  paiVar5 = p->VarMarks[lVar12 + 2] + 1;
LAB_005a8c12:
  if ((int)uVar3 < 1) {
LAB_005a8f25:
    __assert_fail("nLits > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                  ,0x117,"int Maj_ManAddCnfStart(Maj_Man_t *)");
  }
  local_f8 = 0;
  local_e8 = lVar13;
  local_d8 = paaiVar10;
  local_d0 = paiVar5;
  local_c8 = paaiVar10;
  do {
    uVar4 = 0;
    nlits = 0;
    do {
      iVar2 = (*local_d8)[0][uVar4];
      if (iVar2 != 0) {
        if (iVar2 < 0) {
LAB_005a8ec8:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        lVar12 = (long)(int)nlits;
        nlits = nlits + 1;
        local_b8[lVar12] = iVar2 * 2;
      }
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
    if ((int)nlits < 1) goto LAB_005a8f25;
    plits = local_b8;
    local_e0 = paiVar5;
    iVar2 = bmcg_sat_solver_addclause(p->pSat,(int *)plits,nlits);
    if (iVar2 == 0) {
      return 0;
    }
    piVar11 = (int *)(ulong)nlits;
    piVar7 = (int *)0x0;
    local_f0 = piVar11;
    do {
      piVar8 = (int *)((long)piVar7 + 1);
      if (piVar8 < local_f0) {
        piVar14 = (int *)0x1;
        do {
          if ((int)local_b8[(long)piVar7] < 0) {
LAB_005a8ea9:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x131,"int Abc_LitNot(int)");
          }
          local_100 = local_b8[(long)piVar7] ^ 1;
          if ((int)plits[(long)piVar14] < 0) goto LAB_005a8ea9;
          local_fc = plits[(long)piVar14] ^ 1;
          iVar2 = bmcg_sat_solver_addclause(p->pSat,(int *)&local_100,2);
          if (iVar2 == 0) {
            return 0;
          }
          piVar14 = (int *)((long)piVar14 + 1);
        } while (piVar11 != piVar14);
      }
      paiVar5 = local_e0;
      lVar12 = local_e8;
      plits = plits + 1;
      piVar11 = (int *)((long)piVar11 + -1);
      piVar7 = piVar8;
    } while (piVar8 != local_f0);
    uVar3 = p->nObjs;
    if (local_f8 == 2) break;
    if (0 < (int)uVar3) {
      lVar13 = 0;
      paiVar9 = local_e0;
      do {
        if ((local_c0[lVar12][local_f8][lVar13] != 0) && (lVar13 < (int)uVar3)) {
          local_f0 = local_c0[lVar12][local_f8] + lVar13;
          lVar6 = 0;
          do {
            iVar2 = (*paiVar9)[lVar6];
            if (iVar2 != 0) {
              if ((*local_f0 < 0) || (local_100 = *local_f0 * 2 + 1, iVar2 < 0)) goto LAB_005a8ec8;
              local_fc = iVar2 * 2 + 1;
              iVar2 = bmcg_sat_solver_addclause(p->pSat,(int *)&local_100,2);
              if (iVar2 == 0) {
                return 0;
              }
              uVar3 = p->nObjs;
            }
            lVar6 = lVar6 + 1;
          } while ((int)lVar6 + (int)lVar13 < (int)uVar3);
        }
        lVar13 = lVar13 + 1;
        paiVar9 = (int (*) [32])(*paiVar9 + 1);
      } while (lVar13 < (int)uVar3);
    }
    local_f8 = local_f8 + 1;
    local_d8 = (int (*) [3] [32])(*local_d8 + 1);
    paiVar5 = paiVar5 + 1;
    if ((int)uVar3 < 1) goto LAB_005a8f25;
  } while( true );
  lVar13 = local_e8 + 1;
  paaiVar10 = local_c8 + 1;
  paiVar5 = local_d0 + 3;
  if ((int)uVar3 <= lVar13) goto LAB_005a8e33;
  goto LAB_005a8c12;
}

Assistant:

int Maj_ManAddCnfStart( Maj_Man_t * p )
{
    int pLits[MAJ_NOBJS], pLits2[2], i, j, k, n, m;
    // input constraints
    for ( i = p->nVars + 2; i < p->nObjs; i++ )
    {
        for ( k = 0; k < 3; k++ )
        {
            int nLits = 0;
            for ( j = 0; j < p->nObjs; j++ )
                if ( p->VarMarks[i][k][j] )
                    pLits[nLits++] = Abc_Var2Lit( p->VarMarks[i][k][j], 0 );
            assert( nLits > 0 );
            // input uniqueness
            if ( !bmcg_sat_solver_addclause( p->pSat, pLits, nLits ) )
                return 0;
            for ( n = 0;   n < nLits; n++ )
            for ( m = n+1; m < nLits; m++ )
            {
                pLits2[0] = Abc_LitNot(pLits[n]);
                pLits2[1] = Abc_LitNot(pLits[m]);
                if ( !bmcg_sat_solver_addclause( p->pSat, pLits2, 2 ) )
                    return 0;
            }
            if ( k == 2 )
                break;
            // symmetry breaking
            for ( j = 0; j < p->nObjs; j++ ) if ( p->VarMarks[i][k][j] )
            for ( n = j; n < p->nObjs; n++ ) if ( p->VarMarks[i][k+1][n] )
            {
                pLits2[0] = Abc_Var2Lit( p->VarMarks[i][k][j], 1 );
                pLits2[1] = Abc_Var2Lit( p->VarMarks[i][k+1][n], 1 );
                if ( !bmcg_sat_solver_addclause( p->pSat, pLits2, 2 ) )
                    return 0;
            }
        }
    }
    // outputs should be used
    for ( i = 2; i < p->nObjs - 1; i++ )
    {
        Vec_Int_t * vArray = Vec_WecEntry(p->vOutLits, i);
        assert( Vec_IntSize(vArray) > 0 );
        if ( !bmcg_sat_solver_addclause( p->pSat, Vec_IntArray(vArray), Vec_IntSize(vArray) ) )
            return 0;
    }
    return 1;
}